

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool LargeIntRegMultiply<unsigned_long,_int>::RegMultiply(uint64_t *a,int32_t b,uint64_t *pRet)

{
  uint64_t *in_RDX;
  uint32_t in_ESI;
  uint64_t *in_RDI;
  undefined1 local_1;
  
  if (((int)in_ESI < 0) && (*in_RDI != 0)) {
    local_1 = false;
  }
  else {
    local_1 = LargeIntRegMultiply<unsigned_long,_unsigned_int>::RegMultiply(in_RDI,in_ESI,in_RDX);
  }
  return local_1;
}

Assistant:

static bool RegMultiply( const std::uint64_t& a, std::int32_t b, std::uint64_t* pRet ) SAFEINT_NOTHROW
    {
        if( b < 0 && a != 0 )
            return false;

#if SAFEINT_USE_INTRINSICS || SAFEINT_HAS_INT128
        return MultiplyUint64( a, (std::uint64_t)b, pRet );
#else
        return LargeIntRegMultiply< std::uint64_t, std::uint32_t >::RegMultiply(a, (std::uint32_t)b, pRet);
#endif
    }